

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

double __thiscall
Js::JavascriptCallStackLayout::GetDoubleAtOffset(JavascriptCallStackLayout *this,int offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double *dblPtr;
  int offset_local;
  JavascriptCallStackLayout *this_local;
  
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,CheckAlignmentFlag)
  ;
  if ((bVar2) && (((ulong)(this + offset) & 7) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x2b,"(((((LONG_PTR)dblPtr) & (sizeof(double)-1)) == 0))",
                                "FAligned(dblPtr, double)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return *(double *)(this + offset);
}

Assistant:

double JavascriptCallStackLayout::GetDoubleAtOffset(int offset) const
    {
        double *dblPtr = (double *)(((char *)this) + offset);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::CheckAlignmentFlag))
        {
            Assert(FAligned(dblPtr, double));
        }
#endif
        return *dblPtr;
    }